

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall
kratos::PackedStruct::PackedStruct
          (PackedStruct *this,string *struct_name,
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
          *attributes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer ptVar3;
  undefined8 uVar4;
  pointer ptVar5;
  PackedStructFieldDef local_70;
  PackedStruct *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->struct_name).field_2;
  (this->struct_name)._M_dataplus._M_p = (pointer)local_38;
  pcVar2 = (struct_name->_M_dataplus)._M_p;
  paVar1 = &struct_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar4 = *(undefined8 *)((long)&struct_name->field_2 + 8);
    local_38->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->struct_name).field_2 + 8) = uVar4;
  }
  else {
    (this->struct_name)._M_dataplus._M_p = pcVar2;
    (this->struct_name).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->struct_name)._M_string_length = struct_name->_M_string_length;
  (struct_name->_M_dataplus)._M_p = (pointer)paVar1;
  struct_name->_M_string_length = 0;
  (struct_name->field_2)._M_local_buf[0] = '\0';
  *(undefined8 *)
   ((long)&(this->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->attributes).
  super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attributes).
  super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ptVar5 = (attributes->
           super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ptVar3 = (attributes->
           super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar5 != ptVar3) {
    paVar1 = &local_70.name.field_2;
    local_40 = this;
    do {
      local_70.struct_ = (PackedStruct *)0x0;
      local_70.name.field_2._M_allocated_capacity = 0;
      local_70.name.field_2._8_8_ = 0;
      local_70.name._M_string_length = 0;
      local_70._32_8_ =
           (ulong)(ptVar5->
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
                  ).super__Tuple_impl<1UL,_unsigned_int,_bool>.super__Tuple_impl<2UL,_bool>.
                  super__Head_base<2UL,_bool,_false>._M_head_impl << 0x20;
      local_70.name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_assign((string *)&local_70);
      local_70.width =
           (ptVar5->
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
           ).super__Tuple_impl<1UL,_unsigned_int,_bool>.super__Head_base<1UL,_unsigned_int,_false>.
           _M_head_impl;
      std::vector<kratos::PackedStructFieldDef,std::allocator<kratos::PackedStructFieldDef>>::
      emplace_back<kratos::PackedStructFieldDef&>
                ((vector<kratos::PackedStructFieldDef,std::allocator<kratos::PackedStructFieldDef>>
                  *)&this->attributes,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_70.name._M_dataplus._M_p,
                        local_70.name.field_2._M_allocated_capacity + 1);
      }
      ptVar5 = ptVar5 + 1;
    } while (ptVar5 != ptVar3);
  }
  return;
}

Assistant:

PackedStruct::PackedStruct(std::string struct_name,
                           const std::vector<std::tuple<std::string, uint32_t, bool>> &attributes)
    : struct_name(std::move(struct_name)) {
    for (auto const &[name, size, signed_] : attributes) {
        auto def = PackedStructFieldDef();
        def.signed_ = signed_;
        def.name = name;
        def.width = size;
        this->attributes.emplace_back(def);
    }
}